

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::rc::Texture1D::Texture1D(Texture1D *this,deUint32 name)

{
  Texture::Texture(&this->super_Texture,name,TYPE_1D);
  (this->super_Texture).super_NamedObject._vptr_NamedObject = (_func_int **)&PTR__Texture1D_0072ae20
  ;
  TextureLevelArray::TextureLevelArray(&this->m_levels);
  (this->m_view).m_numLevels = 0;
  (this->m_view).m_levels = (ConstPixelBufferAccess *)0x0;
  return;
}

Assistant:

Texture1D::Texture1D (deUint32 name)
	: Texture	(name, TYPE_1D)
	, m_view	(0, DE_NULL)
{
}